

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_push_onto_queue(REF_INTERP ref_interp,REF_INT node)

{
  int node_00;
  REF_NODE pRVar1;
  REF_INT *pRVar2;
  REF_AGENT_STRUCT *pRVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  REF_AGENTS ref_agents;
  ulong uVar10;
  long lVar11;
  REF_INT id;
  REF_AGENTS local_370;
  REF_INT nneighbor;
  ulong local_360;
  REF_INT neighbors [200];
  
  if (-1 < node) {
    pRVar1 = ref_interp->to_grid->node;
    if ((node < pRVar1->max) && (uVar10 = (ulong)(uint)node, -1 < pRVar1->global[uVar10])) {
      if (pRVar1->ref_mpi->id == pRVar1->part[uVar10]) {
        if (ref_interp->cell[uVar10] != -1) {
          local_370 = ref_interp->ref_agents;
          uVar5 = ref_grid_node_list_around(ref_interp->to_grid,node,200,&nneighbor,neighbors);
          if ((uVar5 != 0) && (uVar5 != 7)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x330,"ref_interp_push_onto_queue",(ulong)uVar5,"neighbors");
            return uVar5;
          }
          lVar11 = 0;
          ref_agents = local_370;
          local_360 = uVar10;
          do {
            if (nneighbor <= lVar11) {
              return 0;
            }
            node_00 = neighbors[lVar11];
            lVar9 = (long)node_00;
            if (pRVar1->ref_mpi->id == pRVar1->part[lVar9]) {
              pRVar2 = ref_interp->cell;
              if ((pRVar2[lVar9] == -1) && (ref_interp->agent_hired[lVar9] == 0)) {
                ref_interp->agent_hired[lVar9] = 1;
                uVar5 = ref_agents_push(local_370,node_00,ref_interp->part[local_360],
                                        pRVar2[local_360],pRVar1->real + lVar9 * 0xf,&id);
                ref_agents = local_370;
                if (uVar5 != 0) {
                  uVar7 = 0x33a;
                  goto LAB_001677b9;
                }
              }
            }
            else {
              uVar5 = ref_agents_push(ref_agents,node_00,ref_interp->part[local_360],
                                      ref_interp->cell[local_360],pRVar1->real + lVar9 * 0xf,&id);
              if (uVar5 != 0) {
                uVar7 = 0x340;
LAB_001677b9:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,uVar7,"ref_interp_push_onto_queue",(ulong)uVar5,"enque");
                return uVar5;
              }
              pRVar3 = ref_agents->agent;
              pRVar3[id].mode = REF_AGENT_SUGGESTION;
              pRVar3[id].node = -1;
              pRVar3[id].home = pRVar1->part[lVar9];
              lVar4 = -1;
              lVar6 = lVar4;
              if (((-1 < node_00) && (node_00 < pRVar1->max)) &&
                 (lVar6 = pRVar1->global[lVar9], pRVar1->global[lVar9] < 0)) {
                lVar6 = lVar4;
              }
              pRVar3[id].global = lVar6;
            }
            lVar11 = lVar11 + 1;
          } while( true );
        }
        pcVar8 = "no cell for guess";
        uVar7 = 0x32c;
      }
      else {
        pcVar8 = "ghost node";
        uVar7 = 0x32a;
      }
      goto LAB_001676fb;
    }
  }
  pcVar8 = "invalid node";
  uVar7 = 0x329;
LAB_001676fb:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar7,
         "ref_interp_push_onto_queue",pcVar8);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_push_onto_queue(REF_INTERP ref_interp,
                                                     REF_INT node) {
  REF_GRID ref_grid = ref_interp_to_grid(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT neighbor, nneighbor, neighbors[MAX_NODE_LIST];
  REF_INT id, other;

  RAS(ref_node_valid(ref_node, node), "invalid node");
  RAS(ref_node_owned(ref_node, node), "ghost node");

  RUS(REF_EMPTY, ref_interp->cell[node], "no cell for guess");

  RXS(ref_grid_node_list_around(ref_grid, node, MAX_NODE_LIST, &nneighbor,
                                neighbors),
      REF_INCREASE_LIMIT, "neighbors");
  for (neighbor = 0; neighbor < nneighbor; neighbor++) {
    other = neighbors[neighbor];
    if (ref_node_owned(ref_node, other)) {
      if (ref_interp->cell[other] == REF_EMPTY &&
          !(ref_interp->agent_hired[other])) {
        ref_interp->agent_hired[other] = REF_TRUE;
        RSS(ref_agents_push(ref_agents, other, ref_interp->part[node],
                            ref_interp->cell[node],
                            ref_node_xyz_ptr(ref_node, other), &id),
            "enque");
      }
    } else { /* add ghost seeding via REF_AGENT_SUGGESTION mode */
      RSS(ref_agents_push(ref_agents, other, ref_interp->part[node],
                          ref_interp->cell[node],
                          ref_node_xyz_ptr(ref_node, other), &id),
          "enque");
      ref_agent_mode(ref_agents, id) = REF_AGENT_SUGGESTION;
      ref_agent_node(ref_agents, id) = REF_EMPTY;
      ref_agent_home(ref_agents, id) = ref_node_part(ref_node, other);
      ref_agent_global(ref_agents, id) = ref_node_global(ref_node, other);
    }
  }

  return REF_SUCCESS;
}